

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmt_tests.cpp
# Opt level: O0

void __thiscall pmt_tests::pmt_malleability::test_method(pmt_malleability *this)

{
  initializer_list<uint256> __l;
  initializer_list<bool> __l_00;
  bool bVar1;
  long in_FS_OFFSET;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  vector<uint256,_std::allocator<uint256>_> vTxid;
  CPartialMerkleTree tree;
  vector<bool,_std::allocator<bool>_> vMatch;
  CPartialMerkleTree *in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  assertion_result *in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  size_t line_num;
  allocator_type *in_stack_fffffffffffffcd0;
  const_string *file;
  vector<bool,_std::allocator<bool>_> *this_00;
  iterator vTxid_00;
  size_type in_stack_fffffffffffffce8;
  CPartialMerkleTree *this_01;
  CPartialMerkleTree *this_02;
  const_string local_2e0 [2];
  lazy_ostream local_2c0 [2];
  assertion_result local_2a0 [3];
  CPartialMerkleTree local_194 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (vector<bool,_std::allocator<bool>_> *)
            ((long)&local_194[0].vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start + 4);
  memcpy(this_00,&DAT_01c18120,0x180);
  vTxid_00 = (iterator)&stack0xfffffffffffffdb7;
  std::allocator<uint256>::allocator((allocator<uint256> *)in_stack_fffffffffffffc98);
  __l._M_len = in_stack_fffffffffffffce8;
  __l._M_array = vTxid_00;
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)this_00,__l,in_stack_fffffffffffffcd0);
  std::allocator<uint256>::~allocator((allocator<uint256> *)in_stack_fffffffffffffc98);
  local_194[0].nTransactions._0_1_ = 0;
  local_194[0].nTransactions._1_1_ = 0;
  local_194[0].nTransactions._2_1_ = 0;
  local_194[0].nTransactions._3_1_ = 0;
  local_194[0]._4_1_ = 0;
  local_194[0]._5_1_ = 0;
  local_194[0]._6_1_ = 0;
  local_194[0]._7_1_ = 0;
  local_194[0].vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p._0_1_ = 0;
  local_194[0].vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p._1_1_ = 1;
  local_194[0].vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p._2_1_ = 1;
  local_194[0].vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p._3_1_ = 0;
  this_01 = local_194;
  this_02 = (CPartialMerkleTree *)0xc;
  file = (const_string *)&stack0xfffffffffffffdb6;
  std::allocator<bool>::allocator((allocator<bool> *)in_stack_fffffffffffffc98);
  __l_00._M_len = (size_type)this_01;
  __l_00._M_array = (iterator)vTxid_00;
  std::vector<bool,_std::allocator<bool>_>::vector(this_00,__l_00,(allocator_type *)file);
  std::allocator<bool>::~allocator((allocator<bool> *)in_stack_fffffffffffffc98);
  CPartialMerkleTree::CPartialMerkleTree
            (this_01,(vector<uint256,_std::allocator<uint256>_> *)vTxid_00,this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc98);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffca8,
               (pointer)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
               (unsigned_long)in_stack_fffffffffffffc98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,file,line_num,
               (const_string *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
    CPartialMerkleTree::ExtractMatches
              (this_02,(vector<uint256,_std::allocator<uint256>_> *)this_01,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)vTxid_00);
    in_stack_fffffffffffffcc7 =
         base_blob<256U>::IsNull((base_blob<256U> *)in_stack_fffffffffffffca8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffca8,(bool)in_stack_fffffffffffffca7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffca8,
               (pointer)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
               (unsigned_long)in_stack_fffffffffffffc98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffca8,
               (pointer)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
               (unsigned_long)in_stack_fffffffffffffc98);
    in_stack_fffffffffffffc98 = (CPartialMerkleTree *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2a0,local_2c0,local_2e0,0x7d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffc98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc98);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffca8);
  CPartialMerkleTree::~CPartialMerkleTree(in_stack_fffffffffffffc98);
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc98);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffca8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(pmt_malleability)
{
    std::vector<uint256> vTxid{
        uint256{1}, uint256{2},
        uint256{3}, uint256{4},
        uint256{5}, uint256{6},
        uint256{7}, uint256{8},
        uint256{9}, uint256{10},
        uint256{9}, uint256{10},
    };
    std::vector<bool> vMatch = {false, false, false, false, false, false, false, false, false, true, true, false};

    CPartialMerkleTree tree(vTxid, vMatch);
    std::vector<unsigned int> vIndex;
    BOOST_CHECK(tree.ExtractMatches(vTxid, vIndex).IsNull());
}